

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O3

Result __thiscall wabt::WastParser::ParseTryTableCatches(WastParser *this,TryTableVector *catches)

{
  Var *this_00;
  Var *this_01;
  TokenType TVar1;
  TokenType TVar2;
  Result RVar3;
  Token token;
  Token local_128;
  TableCatch local_e8;
  
  TVar1 = Peek(this,0);
  TVar2 = Peek(this,1);
  if ((CONCAT44(TVar2,TVar1) & 0xfffffffcffffffff) == 0x4c0000001e) {
    this_00 = &local_e8.tag;
    this_01 = &local_e8.target;
    do {
      Consume((Token *)&local_e8,this);
      GetToken(&local_128,this);
      local_e8.loc.field_1.field_1.offset = local_128.loc.field_1.field_1.offset;
      local_e8.loc.field_1._8_8_ = local_128.loc.field_1._8_8_;
      local_e8.loc.filename._M_len = local_128.loc.filename._M_len;
      local_e8.loc.filename._M_str = local_128.loc.filename._M_str;
      Var::Var(this_00);
      Var::Var(this_01);
      Consume(&local_128,this);
      switch(local_128.token_type_) {
      case Catch:
        local_e8.kind = Catch;
        goto LAB_001993cd;
      case CatchAll:
        local_e8.kind = CatchAll;
        break;
      case CatchRef:
        local_e8.kind = CatchRef;
LAB_001993cd:
        RVar3 = ParseVar(this,this_00);
        if (RVar3.enum_ == Error) goto LAB_00199483;
        break;
      case CatchAllRef:
        local_e8.kind = CatchAllRef;
        break;
      default:
        abort();
      }
      RVar3 = ParseVar(this,this_01);
      if ((RVar3.enum_ == Error) || (RVar3 = Expect(this,Rpar), RVar3.enum_ == Error)) {
LAB_00199483:
        Var::~Var(this_01);
        Var::~Var(this_00);
        return (Result)Error;
      }
      std::vector<wabt::TableCatch,_std::allocator<wabt::TableCatch>_>::
      emplace_back<wabt::TableCatch>(catches,&local_e8);
      Var::~Var(this_01);
      Var::~Var(this_00);
      TVar1 = Peek(this,0);
      TVar2 = Peek(this,1);
    } while (((ulong)TVar1 | ((ulong)TVar2 & 0xfffffffc) << 0x20) == 0x4c0000001e);
  }
  return (Result)Ok;
}

Assistant:

Result WastParser::ParseTryTableCatches(TryTableVector* catches) {
  WABT_TRACE(ParseTryTableCatches);

  while (IsTryTableCatch(PeekPair())) {
    Consume();
    TableCatch catch_(GetLocation());
    auto token = Consume();
    switch (token.token_type()) {
      case TokenType::Catch:
        catch_.kind = CatchKind::Catch;
        break;
      case TokenType::CatchRef:
        catch_.kind = CatchKind::CatchRef;
        break;
      case TokenType::CatchAll:
        catch_.kind = CatchKind::CatchAll;
        break;
      case TokenType::CatchAllRef:
        catch_.kind = CatchKind::CatchAllRef;
        break;
      default:
        WABT_UNREACHABLE;
    }
    if (catch_.kind == CatchKind::Catch || catch_.kind == CatchKind::CatchRef) {
      CHECK_RESULT(ParseVar(&catch_.tag));
    }
    CHECK_RESULT(ParseVar(&catch_.target));
    EXPECT(Rpar);
    catches->push_back(std::move(catch_));
  }

  return Result::Ok;
}